

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Slice_x86::forward
          (Slice_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *this_00;
  uint uVar1;
  uint uVar2;
  Mat *m;
  ulong _elemsize;
  size_t sVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  size_t i_6;
  long lVar12;
  int *piVar13;
  void *pvVar14;
  pointer pMVar15;
  void *pvVar16;
  int iVar17;
  int iVar18;
  undefined4 *puVar19;
  int iVar20;
  void *pvVar21;
  int iVar22;
  int iVar23;
  size_t i_2;
  int iVar24;
  size_t i;
  ulong uVar25;
  pointer pMVar26;
  bool bVar27;
  void *local_120;
  int local_100;
  Mat bottom_blob_unpacked;
  Mat local_78;
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar1 = m->dims;
  _elemsize = m->elemsize;
  iVar24 = m->elempack;
  uVar5 = (ulong)iVar24;
  lVar11 = *(long *)(&this->field_0xd0 + (long)this->_vptr_Slice_x86[-3]);
  iVar8 = *(int *)(&this->field_0x118 + (long)this->_vptr_Slice_x86[-3]);
  if (uVar1 == 1) {
    iVar23 = m->w;
    lVar10 = 0;
    lVar12 = 0;
    uVar25 = 0;
    iVar22 = 0;
    while( true ) {
      pMVar26 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48;
      if (uVar6 <= uVar25) break;
      uVar2 = *(uint *)(lVar11 + uVar25 * 4);
      uVar7 = (ulong)uVar2;
      if (uVar2 == 0xffffff17) {
        uVar7 = (ulong)(long)(iVar23 * iVar24 - iVar22) / (uVar6 + lVar10);
      }
      bVar4 = (uVar7 & 3) == 0 & opt->use_packing_layout;
      iVar20 = (uint)bVar4 + (uint)bVar4 * 2 + 1;
      Mat::create((Mat *)((long)&pMVar26->data + lVar12),
                  (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                       (long)iVar20),_elemsize / uVar5 << bVar4 * '\x02',iVar20,opt->blob_allocator)
      ;
      pvVar21 = *(void **)((long)&pMVar26->data + lVar12);
      if (pvVar21 == (void *)0x0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar26->c + lVar12) * *(long *)((long)&pMVar26->cstep + lVar12) ==
          0) {
        return -100;
      }
      memcpy(pvVar21,(void *)((long)iVar22 * 4 + (long)m->data),
             (long)*(int *)((long)&pMVar26->w + lVar12) *
             *(long *)((long)&pMVar26->elemsize + lVar12));
      iVar22 = (int)uVar7 + iVar22;
      uVar25 = uVar25 + 1;
      lVar12 = lVar12 + 0x48;
      lVar10 = lVar10 + -1;
    }
  }
  iVar8 = (iVar8 >> 0x1f & uVar1) + iVar8;
  if ((uVar1 == 2) && (iVar8 == 0)) {
    iVar23 = m->w;
    iVar22 = m->h;
    lVar12 = 0;
    lVar10 = 0;
    uVar25 = 0;
    iVar20 = 0;
    while( true ) {
      pMVar26 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48;
      if (uVar6 <= uVar25) break;
      uVar2 = *(uint *)(lVar11 + uVar25 * 4);
      uVar7 = (ulong)uVar2;
      if (uVar2 == 0xffffff17) {
        uVar7 = (ulong)(long)(iVar22 * iVar24 - iVar20) / (uVar6 + lVar12);
      }
      bVar4 = (uVar7 & 3) == 0 & opt->use_packing_layout;
      iVar17 = (uint)bVar4 + (uint)bVar4 * 2 + 1;
      Mat::create((Mat *)((long)&pMVar26->data + lVar10),iVar23,
                  (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                       (long)iVar17),_elemsize / uVar5 << bVar4 * '\x02',iVar17,opt->blob_allocator)
      ;
      if (*(long *)((long)&pMVar26->data + lVar10) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar26->c + lVar10) * *(long *)((long)&pMVar26->cstep + lVar10) ==
          0) {
        return -100;
      }
      iVar20 = (int)uVar7 + iVar20;
      uVar25 = uVar25 + 1;
      lVar10 = lVar10 + 0x48;
      lVar12 = lVar12 + -1;
    }
    iVar22 = pMVar26->elempack;
    piVar13 = &pMVar26->elempack;
    while (bVar27 = uVar6 != 0, uVar6 = uVar6 - 1, bVar27) {
      if (*piVar13 < iVar22) {
        iVar22 = *piVar13;
      }
      piVar13 = piVar13 + 0x12;
    }
    Mat::Mat(&bottom_blob_unpacked,m);
    if (iVar22 < iVar24) {
      convert_packing(m,&bottom_blob_unpacked,iVar22,opt);
    }
    iVar20 = 0;
    if (0 < iVar23) {
      iVar20 = iVar23;
    }
    lVar10 = (long)(iVar23 * 4) * 4;
    pvVar21 = bottom_blob_unpacked.data;
    for (uVar25 = 0;
        pMVar26 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar25 < (ulong)(((long)(top_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48);
        uVar25 = uVar25 + 1) {
      pMVar15 = pMVar26 + uVar25;
      iVar17 = pMVar26[uVar25].elempack;
      if ((iVar22 == 1) && (iVar17 == 4)) {
        uVar6 = (ulong)(uint)pMVar15->h;
        if (pMVar15->h < 1) {
          uVar6 = 0;
        }
        pvVar9 = (void *)((long)(iVar23 * 3) * 4 + (long)pvVar21);
        pvVar14 = (void *)((long)(iVar23 * 2) * 4 + (long)pvVar21);
        pvVar16 = (void *)((long)iVar23 * 4 + (long)pvVar21);
        for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
          puVar19 = (undefined4 *)
                    ((long)pMVar15->w * uVar7 * pMVar15->elemsize + (long)pMVar15->data);
          for (lVar12 = 0; iVar20 != (int)lVar12; lVar12 = lVar12 + 1) {
            *puVar19 = *(undefined4 *)((long)pvVar21 + lVar12 * 4);
            puVar19[1] = *(undefined4 *)((long)pvVar16 + lVar12 * 4);
            puVar19[2] = *(undefined4 *)((long)pvVar14 + lVar12 * 4);
            puVar19[3] = *(undefined4 *)((long)pvVar9 + lVar12 * 4);
            puVar19 = puVar19 + 4;
          }
          pvVar21 = (void *)((long)pvVar21 + lVar10);
          pvVar9 = (void *)((long)pvVar9 + lVar10);
          pvVar14 = (void *)((long)pvVar14 + lVar10);
          pvVar16 = (void *)((long)pvVar16 + lVar10);
        }
      }
      if (iVar22 == iVar17) {
        lVar12 = (long)pMVar15->h * (long)iVar23;
        memcpy(pMVar15->data,pvVar21,pMVar15->elemsize * lVar12);
        pvVar21 = (void *)((long)pvVar21 + (long)(int)lVar12 * (long)pMVar15->elempack * 4);
      }
    }
    Mat::~Mat(&bottom_blob_unpacked);
  }
  if ((uVar1 == 2) && (iVar8 == 1)) {
    iVar23 = m->w;
    uVar2 = m->h;
    uVar6 = (ulong)uVar2;
    lVar12 = 0;
    lVar10 = 0;
    uVar25 = 0;
    iVar22 = 0;
    while( true ) {
      pMVar26 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      uVar7 = ((long)pMVar15 - (long)pMVar26) / 0x48;
      if (uVar7 <= uVar25) break;
      iVar20 = *(int *)(lVar11 + uVar25 * 4);
      if (iVar20 == -0xe9) {
        iVar20 = (int)((ulong)((long)iVar23 - (long)iVar22) / (uVar7 + lVar12));
      }
      Mat::create((Mat *)((long)&pMVar26->data + lVar10),iVar20,uVar2,_elemsize,iVar24,
                  opt->blob_allocator);
      if (*(long *)((long)&pMVar26->data + lVar10) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar26->c + lVar10) * *(long *)((long)&pMVar26->cstep + lVar10) ==
          0) {
        return -100;
      }
      iVar22 = iVar20 + iVar22;
      uVar25 = uVar25 + 1;
      lVar10 = lVar10 + 0x48;
      lVar12 = lVar12 + -1;
    }
    uVar25 = 0;
    if ((int)uVar2 < 1) {
      uVar6 = 0;
    }
    for (; uVar25 != uVar6; uVar25 = uVar25 + 1) {
      pvVar21 = (void *)((long)m->w * uVar25 * m->elemsize + (long)m->data);
      lVar10 = 0x2c;
      for (uVar7 = 0; uVar7 < (ulong)(((long)pMVar15 - (long)pMVar26) / 0x48); uVar7 = uVar7 + 1) {
        lVar12 = (long)*(int *)((long)&pMVar26->data + lVar10);
        memcpy((void *)(uVar25 * lVar12 * *(long *)((long)pMVar26 + lVar10 + -0x1c) +
                       *(long *)((long)pMVar26 + lVar10 + -0x2c)),pvVar21,lVar12 * _elemsize);
        pvVar21 = (void *)((long)pvVar21 + (long)*(int *)((long)&pMVar26->data + lVar10) * uVar5 * 4
                          );
        pMVar26 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar10 = lVar10 + 0x48;
      }
    }
  }
  if ((uVar1 == 3) && (iVar8 == 0)) {
    iVar23 = m->w;
    iVar22 = m->h;
    iVar20 = m->c;
    lVar10 = 0;
    lVar12 = 0;
    iVar17 = 0;
    uVar25 = 0;
    while( true ) {
      pMVar26 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48;
      if (uVar6 <= uVar25) break;
      uVar2 = *(uint *)(lVar11 + uVar25 * 4);
      uVar7 = (ulong)uVar2;
      if (uVar2 == 0xffffff17) {
        uVar7 = (ulong)(long)(iVar20 * iVar24 - iVar17) / (uVar6 + lVar10);
      }
      bVar4 = (uVar7 & 3) == 0 & opt->use_packing_layout;
      iVar18 = (uint)bVar4 + (uint)bVar4 * 2 + 1;
      Mat::create((Mat *)((long)&pMVar26->data + lVar12),iVar23,iVar22,
                  (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                       (long)iVar18),_elemsize / uVar5 << bVar4 * '\x02',iVar18,opt->blob_allocator)
      ;
      if (*(long *)((long)&pMVar26->data + lVar12) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar26->c + lVar12) * *(long *)((long)&pMVar26->cstep + lVar12) ==
          0) {
        return -100;
      }
      iVar17 = (int)uVar7 + iVar17;
      uVar25 = uVar25 + 1;
      lVar12 = lVar12 + 0x48;
      lVar10 = lVar10 + -1;
    }
    local_100 = pMVar26->elempack;
    piVar13 = &pMVar26->elempack;
    while (bVar27 = uVar6 != 0, uVar6 = uVar6 - 1, bVar27) {
      if (*piVar13 < local_100) {
        local_100 = *piVar13;
      }
      piVar13 = piVar13 + 0x12;
    }
    Mat::Mat(&bottom_blob_unpacked,m);
    if (local_100 < iVar24) {
      convert_packing(m,&bottom_blob_unpacked,local_100,opt);
    }
    iVar23 = 0;
    for (uVar25 = 0;
        pMVar26 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar25 < (ulong)(((long)(top_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48);
        uVar25 = uVar25 + 1) {
      this_00 = pMVar26 + uVar25;
      iVar22 = pMVar26[uVar25].elempack;
      if ((local_100 == 1) && (iVar22 == 4)) {
        iVar22 = this_00->h * this_00->w;
        iVar20 = 0;
        if (iVar22 < 1) {
          iVar22 = iVar20;
        }
        while( true ) {
          if (this_00->c <= iVar20) break;
          Mat::channel(&local_78,&bottom_blob_unpacked,iVar23);
          pvVar21 = local_78.data;
          Mat::~Mat(&local_78);
          Mat::channel(&local_78,&bottom_blob_unpacked,iVar23 + 1);
          pvVar9 = local_78.data;
          Mat::~Mat(&local_78);
          Mat::channel(&local_78,&bottom_blob_unpacked,iVar23 + 2);
          pvVar14 = local_78.data;
          Mat::~Mat(&local_78);
          Mat::channel(&local_78,&bottom_blob_unpacked,iVar23 + 3);
          pvVar16 = local_78.data;
          Mat::~Mat(&local_78);
          Mat::channel(&local_78,this_00,iVar20);
          puVar19 = (undefined4 *)local_78.data;
          Mat::~Mat(&local_78);
          for (lVar10 = 0; iVar22 != (int)lVar10; lVar10 = lVar10 + 1) {
            *puVar19 = *(undefined4 *)((long)pvVar21 + lVar10 * 4);
            puVar19[1] = *(undefined4 *)((long)pvVar9 + lVar10 * 4);
            puVar19[2] = *(undefined4 *)((long)pvVar14 + lVar10 * 4);
            puVar19[3] = *(undefined4 *)((long)pvVar16 + lVar10 * 4);
            puVar19 = puVar19 + 4;
          }
          iVar23 = iVar23 + 4;
          iVar20 = iVar20 + 1;
        }
        iVar22 = this_00->elempack;
      }
      if (local_100 == iVar22) {
        sVar3 = this_00->cstep;
        iVar22 = this_00->c;
        Mat::channel(&local_78,&bottom_blob_unpacked,iVar23);
        pvVar21 = local_78.data;
        Mat::~Mat(&local_78);
        memcpy(this_00->data,pvVar21,(long)((int)sVar3 * iVar22) * this_00->elemsize);
        iVar23 = iVar23 + this_00->c;
      }
    }
    Mat::~Mat(&bottom_blob_unpacked);
  }
  if ((uVar1 == 3) && (iVar8 == 1)) {
    iVar23 = m->w;
    iVar22 = m->c;
    iVar20 = m->h;
    lVar10 = 0;
    lVar12 = 0;
    iVar17 = 0;
    uVar25 = 0;
    while( true ) {
      pMVar26 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48;
      if (uVar6 <= uVar25) break;
      iVar18 = *(int *)(lVar11 + uVar25 * 4);
      if (iVar18 == -0xe9) {
        iVar18 = (int)((ulong)((long)iVar20 - (long)iVar17) / (uVar6 + lVar10));
      }
      Mat::create((Mat *)((long)&pMVar26->data + lVar12),iVar23,iVar18,iVar22,_elemsize,iVar24,
                  opt->blob_allocator);
      if (*(long *)((long)&pMVar26->data + lVar12) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar26->c + lVar12) * *(long *)((long)&pMVar26->cstep + lVar12) ==
          0) {
        return -100;
      }
      iVar17 = iVar18 + iVar17;
      uVar25 = uVar25 + 1;
      lVar12 = lVar12 + 0x48;
      lVar10 = lVar10 + -1;
    }
    iVar23 = 0;
    if (iVar22 < 1) {
      iVar22 = 0;
    }
    for (; iVar23 != iVar22; iVar23 = iVar23 + 1) {
      Mat::channel(&bottom_blob_unpacked,m,iVar23);
      pvVar21 = bottom_blob_unpacked.data;
      Mat::~Mat(&bottom_blob_unpacked);
      lVar10 = 0;
      for (uVar25 = 0;
          pMVar26 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start,
          uVar25 < (ulong)(((long)(top_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48);
          uVar25 = uVar25 + 1) {
        lVar12 = (long)*(int *)((long)&pMVar26->h + lVar10) *
                 (long)*(int *)((long)&pMVar26->w + lVar10);
        Mat::channel(&bottom_blob_unpacked,(Mat *)((long)&pMVar26->data + lVar10),iVar23);
        pvVar9 = bottom_blob_unpacked.data;
        Mat::~Mat(&bottom_blob_unpacked);
        memcpy(pvVar9,pvVar21,lVar12 * _elemsize);
        pvVar21 = (void *)((long)pvVar21 + (long)((int)lVar12 * iVar24) * 4);
        lVar10 = lVar10 + 0x48;
      }
    }
  }
  if ((uVar1 == 3) && (iVar8 == 2)) {
    iVar8 = m->w;
    uVar1 = m->h;
    iVar23 = m->c;
    lVar12 = 0;
    lVar10 = 0;
    iVar22 = 0;
    uVar25 = 0;
    while( true ) {
      pMVar26 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48;
      if (uVar6 <= uVar25) break;
      iVar20 = *(int *)(lVar11 + uVar25 * 4);
      if (iVar20 == -0xe9) {
        iVar20 = (int)((ulong)((long)iVar8 - (long)iVar22) / (uVar6 + lVar12));
      }
      Mat::create((Mat *)((long)&pMVar26->data + lVar10),iVar20,uVar1,iVar23,_elemsize,iVar24,
                  opt->blob_allocator);
      if ((*(long *)((long)&pMVar26->data + lVar10) == 0) ||
         ((long)*(int *)((long)&pMVar26->c + lVar10) * *(long *)((long)&pMVar26->cstep + lVar10) ==
          0)) {
        return -100;
      }
      iVar22 = iVar20 + iVar22;
      uVar25 = uVar25 + 1;
      lVar10 = lVar10 + 0x48;
      lVar12 = lVar12 + -1;
    }
    uVar25 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar25 = 0;
    }
    if (iVar23 < 1) {
      iVar23 = 0;
    }
    for (iVar24 = 0; iVar24 != iVar23; iVar24 = iVar24 + 1) {
      Mat::channel(&bottom_blob_unpacked,m,iVar24);
      local_120 = bottom_blob_unpacked.data;
      Mat::~Mat(&bottom_blob_unpacked);
      for (uVar6 = 0; uVar6 != uVar25; uVar6 = uVar6 + 1) {
        lVar11 = 0;
        for (uVar7 = 0;
            pMVar26 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start,
            uVar7 < (ulong)(((long)(top_blobs->
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48
                           ); uVar7 = uVar7 + 1) {
          Mat::channel(&bottom_blob_unpacked,(Mat *)((long)&pMVar26->data + lVar11),iVar24);
          pvVar21 = (void *)((long)bottom_blob_unpacked.w * uVar6 * bottom_blob_unpacked.elemsize +
                            (long)bottom_blob_unpacked.data);
          Mat::~Mat(&bottom_blob_unpacked);
          memcpy(pvVar21,local_120,(long)*(int *)((long)&pMVar26->w + lVar11) * _elemsize);
          local_120 = (void *)((long)local_120 +
                              (long)*(int *)((long)&pMVar26->w + lVar11) * uVar5 * 4);
          lVar11 = lVar11 + 0x48;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Slice_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // slice vector
        int w = bottom_blob.w * elempack;
        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, top_blob.w * top_blob.elemsize);

            q += slice;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // slice image height
        int w = bottom_blob.w;
        int h = bottom_blob.h * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        const float* ptr = bottom_blob_unpacked;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    ptr += w * 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = w * top_blob.h;

                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                ptr += size * top_blob.elempack;
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // slice image width
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* ptr = bottom_blob.row<const float>(j);
            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                float* outptr = top_blob.row(j);
                memcpy(outptr, ptr, top_blob.w * elemsize);

                ptr += top_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // slice dim channel
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        int p = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    p += 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = top_blob.total();

                const float* ptr = bottom_blob_unpacked.channel(p);
                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                p += top_blob.c;
            }
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // slice dim height
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                int size = top_blob.w * top_blob.h;

                float* outptr = top_blob.channel(p);
                memcpy(outptr, ptr, size * elemsize);

                ptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // slice dim width
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < h; j++)
            {
                for (size_t i = 0; i < top_blobs.size(); i++)
                {
                    Mat& top_blob = top_blobs[i];

                    float* outptr = top_blob.channel(p).row(j);
                    memcpy(outptr, ptr, top_blob.w * elemsize);

                    ptr += top_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}